

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t archive_string_normalize_C(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  size_t sVar2;
  char cVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  archive_string *paVar9;
  long lVar10;
  undefined7 uVar11;
  undefined4 uVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  code *pcVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  undefined8 unaff_R14;
  undefined7 uVar23;
  char *pcVar21;
  long lVar22;
  char *pcVar24;
  undefined1 *puVar25;
  uint32_t uc2;
  uint32_t ucx [10];
  wchar_t ccx [10];
  size_t local_108;
  uint32_t local_fc;
  char *local_f8;
  long local_f0;
  char *local_e8;
  code *local_e0;
  wchar_t local_d4;
  long local_d0;
  long local_c8;
  uint32_t local_bc;
  ulong local_b8;
  ulong local_b0;
  uint local_a8;
  undefined4 local_a4;
  code *local_a0;
  uint local_94;
  char *local_90;
  uint local_88;
  uint local_84;
  undefined1 local_80 [32];
  ulong local_60;
  uint local_58 [10];
  
  wVar1 = sc->flag;
  uVar11 = (undefined7)((ulong)sc >> 8);
  uVar23 = (undefined7)((ulong)unaff_R14 >> 8);
  if (((uint)wVar1 >> 10 & 1) == 0) {
    if (((uint)wVar1 >> 0xc & 1) == 0) {
      if (((uint)wVar1 >> 8 & 1) == 0) {
        if (((uint)wVar1 >> 0xb & 1) == 0) {
          uVar20 = (uint)wVar1 >> 0xd & 1;
          uVar15 = (ulong)uVar20;
          local_f0 = uVar15 + 1;
          pcVar16 = unicode_to_utf8;
          if (uVar20 != 0) {
            pcVar16 = unicode_to_utf16le;
          }
        }
        else {
          pcVar16 = unicode_to_utf16be;
          local_f0 = 2;
          uVar15 = CONCAT71(uVar23,1);
        }
        local_a4 = 0;
      }
      else {
        local_a4 = (undefined4)CONCAT71(uVar11,((uint)wVar1 >> 9 & 1) == 0);
        pcVar16 = unicode_to_utf8;
        local_f0 = 1;
        uVar15 = 0;
      }
      goto LAB_003d4340;
    }
    local_a4 = (undefined4)CONCAT71(uVar11,((uint)wVar1 >> 0xd & 1) == 0);
    pcVar16 = unicode_to_utf16le;
  }
  else {
    local_a4 = (undefined4)CONCAT71(uVar11,((uint)wVar1 >> 0xb & 1) == 0);
    pcVar16 = unicode_to_utf16be;
  }
  local_f0 = 2;
  uVar15 = CONCAT71(uVar23,1);
LAB_003d4340:
  local_d0 = 1;
  local_94 = 4;
  if (((uint)wVar1 >> 0xb & 1) == 0) {
    if (((uint)wVar1 >> 0xd & 1) == 0) {
      local_a0 = cesu8_to_unicode;
      local_94 = 6;
      local_d0 = local_f0;
    }
    else {
      local_a0 = utf16le_to_unicode;
    }
  }
  else {
    local_a0 = utf16be_to_unicode;
  }
  local_f8 = (char *)_p;
  paVar9 = archive_string_ensure(as,local_d0 * len + local_f0 + as->length);
  if (paVar9 == (archive_string *)0x0) {
    return L'\xffffffff';
  }
  pcVar13 = as->s;
  sVar2 = as->buffer_length;
  pcVar17 = pcVar13 + as->length;
  local_e0 = pcVar16;
  local_60 = uVar15;
  uVar20 = (*local_a0)(&local_fc,local_f8,len);
  if (uVar20 == 0) {
    local_d4 = L'\0';
switchD_003d5584_default:
    as->length = (long)pcVar17 - (long)as->s;
    *pcVar17 = '\0';
    if ((char)local_60 != '\0') {
      as->s[as->length + 1] = '\0';
    }
    return local_d4;
  }
  local_c8 = -local_f0;
  pcVar13 = pcVar13 + local_c8 + sVar2;
  local_d4 = L'\0';
  pcVar24 = local_f8;
  local_108 = len;
LAB_003d4411:
  uVar15 = (ulong)uVar20;
  if ((int)uVar20 < 0) {
    lVar10 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,local_fc);
    if (lVar10 == 0) {
      lVar22 = local_108 * local_d0 + local_f0;
      local_f8 = pcVar24;
      do {
        as->length = (long)pcVar17 - (long)as->s;
        paVar9 = archive_string_ensure(as,as->buffer_length + lVar22);
        if (paVar9 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar17 = as->s + as->length;
        pcVar13 = as->s + local_c8 + as->buffer_length;
        lVar10 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,local_fc);
        pcVar24 = local_f8;
      } while (lVar10 == 0);
    }
    pcVar17 = pcVar17 + lVar10;
    pcVar24 = pcVar24 + -uVar20;
    local_108 = local_108 - -uVar20;
  }
  else {
    pcVar21 = pcVar24;
    if (uVar20 == local_94) {
      pcVar21 = (char *)0x0;
    }
    if ((char)local_a4 != '\0') {
      pcVar21 = (char *)0x0;
    }
    pcVar24 = pcVar24 + uVar15;
    local_108 = local_108 - uVar15;
    uVar20 = (*local_a0)(&local_bc,pcVar24);
    uVar6 = local_fc;
    pcVar16 = local_e0;
    local_88 = local_bc;
    uVar19 = local_b0;
    while( true ) {
      local_b0 = uVar15;
      uVar15 = (ulong)uVar20;
      uVar5 = (uint)local_b0;
      local_fc = uVar6;
      local_e0 = pcVar16;
      local_bc = local_88;
      if ((int)uVar20 < 1) break;
      local_e8 = pcVar24;
      if (uVar20 == local_94) {
        local_e8 = (char *)0x0;
      }
      if ((char)local_a4 != '\0') {
        local_e8 = (char *)0x0;
      }
      pcVar24 = pcVar24 + uVar15;
      local_108 = local_108 - uVar15;
      local_f8 = pcVar24;
      if ((local_88 < 0x1d300) && (""[local_88 >> 8] != '\0')) {
        if (0x12 < uVar6 - 0x1100) {
          uVar20 = uVar6 - 0xac00;
          if ((uVar20 < 0x2ba4) && (uVar20 == (uVar20 / 0x1c) * 0x1c)) {
            if (0x1a < local_88 - 0x11a8) {
              if (pcVar21 == (char *)0x0) {
                lVar10 = (*pcVar16)(pcVar17,(long)pcVar13 - (long)pcVar17,uVar6);
                if (lVar10 == 0) {
                  lVar22 = local_108 * local_d0 + local_f0;
                  do {
                    as->length = (long)pcVar17 - (long)as->s;
                    paVar9 = archive_string_ensure(as,as->buffer_length + lVar22);
                    if (paVar9 == (archive_string *)0x0) {
                      return L'\xffffffff';
                    }
                    pcVar17 = as->s + as->length;
                    pcVar13 = as->s + local_c8 + as->buffer_length;
                    lVar10 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,local_fc);
                    pcVar24 = local_f8;
                  } while (lVar10 == 0);
                }
                pcVar17 = pcVar17 + lVar10;
              }
              else {
                if (pcVar13 < pcVar17 + local_b0) {
                  as->length = (long)pcVar17 - (long)as->s;
                  paVar9 = archive_string_ensure
                                     (as,local_108 * local_d0 + local_f0 + as->buffer_length);
                  if (paVar9 == (archive_string *)0x0) {
                    return L'\xffffffff';
                  }
                  pcVar17 = as->s + as->length;
                  pcVar13 = as->s + local_c8 + as->buffer_length;
                  uVar5 = (uint)local_b0;
                }
                pcVar24 = local_f8;
                switch(uVar5) {
                case 1:
                  goto switchD_003d4767_caseD_1;
                case 2:
                  goto switchD_003d4767_caseD_2;
                case 3:
                  goto switchD_003d4767_caseD_3;
                case 4:
                  goto switchD_003d4767_caseD_4;
                }
              }
              goto switchD_003d4767_default;
            }
            local_fc = (uVar6 + local_88) - 0x11a7;
            goto LAB_003d460b;
          }
          local_b8 = uVar15;
          local_90 = pcVar21;
          uVar4 = get_nfc(uVar6,local_88);
          uVar5 = (uint)local_b0;
          if (uVar4 != 0) {
            local_e8 = (char *)0x0;
            pcVar24 = local_f8;
            local_fc = uVar4;
            goto LAB_003d4a06;
          }
          if ((0x1d244 < local_88) ||
             (ccc_val[ccc_val_index[""[local_88 >> 8]][local_88 >> 4 & 0xf]][local_88 & 0xf] == 0))
          {
            if (local_90 == (char *)0x0) {
              lVar10 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,uVar6);
              if (lVar10 == 0) {
                lVar22 = local_108 * local_d0 + local_f0;
                do {
                  as->length = (long)pcVar17 - (long)as->s;
                  paVar9 = archive_string_ensure(as,as->buffer_length + lVar22);
                  if (paVar9 == (archive_string *)0x0) {
                    return L'\xffffffff';
                  }
                  pcVar17 = as->s + as->length;
                  pcVar13 = as->s + local_c8 + as->buffer_length;
                  lVar10 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,local_fc);
                } while (lVar10 == 0);
              }
              pcVar17 = pcVar17 + lVar10;
              uVar15 = local_b8;
              pcVar24 = local_f8;
              goto switchD_003d4767_default;
            }
            if (pcVar13 < pcVar17 + (local_b0 & 0xffffffff)) {
              as->length = (long)pcVar17 - (long)as->s;
              paVar9 = archive_string_ensure(as,local_108 * local_d0 + local_f0 + as->buffer_length)
              ;
              if (paVar9 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              pcVar17 = as->s + as->length;
              pcVar13 = as->s + local_c8 + as->buffer_length;
              uVar5 = (uint)local_b0;
            }
            pcVar21 = local_90;
            uVar15 = local_b8;
            pcVar24 = local_f8;
            switch(uVar5) {
            case 1:
              pcVar24 = local_90;
              goto LAB_003d4b21;
            case 2:
              pcVar24 = local_90;
              break;
            case 4:
              pcVar21 = local_90 + 1;
              *pcVar17 = *local_90;
              pcVar17 = pcVar17 + 1;
            case 3:
              *pcVar17 = *pcVar21;
              pcVar17 = pcVar17 + 1;
              pcVar24 = pcVar21 + 1;
              break;
            default:
              goto switchD_003d4767_default;
            }
            *pcVar17 = *pcVar24;
            pcVar17 = pcVar17 + 1;
            pcVar24 = pcVar24 + 1;
LAB_003d4b21:
            cVar3 = *pcVar24;
LAB_003d49f7:
            *pcVar17 = cVar3;
            pcVar17 = pcVar17 + 1;
            pcVar24 = local_f8;
            goto switchD_003d4767_default;
          }
          uVar20 = (uint)ccc_val[ccc_val_index[""[local_88 >> 8]][local_88 >> 4 & 0xf]]
                         [local_88 & 0xf];
          local_58[0] = uVar20;
          uVar5 = (*local_a0)(&local_84,local_f8,local_108);
          uVar15 = 1;
          if (0 < (int)uVar5) {
            puVar25 = local_80;
            goto LAB_003d4e08;
          }
          local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
          goto LAB_003d4ed7;
        }
        if (0x14 < local_88 - 0x1161) {
          if (pcVar21 != (char *)0x0) {
            if (pcVar13 < pcVar17 + local_b0) {
              as->length = (long)pcVar17 - (long)as->s;
              paVar9 = archive_string_ensure(as,local_108 * local_d0 + local_f0 + as->buffer_length)
              ;
              if (paVar9 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              pcVar17 = as->s + as->length;
              pcVar13 = as->s + local_c8 + as->buffer_length;
              uVar5 = (uint)local_b0;
            }
            pcVar24 = local_f8;
            switch(uVar5) {
            case 1:
switchD_003d4767_caseD_1:
              goto switchD_003d4588_caseD_1;
            case 2:
switchD_003d4767_caseD_2:
              goto switchD_003d4588_caseD_2;
            case 4:
switchD_003d4767_caseD_4:
              cVar3 = *pcVar21;
              pcVar21 = pcVar21 + 1;
              *pcVar17 = cVar3;
              pcVar17 = pcVar17 + 1;
            case 3:
switchD_003d4767_caseD_3:
              break;
            default:
              goto switchD_003d4767_default;
            }
            goto switchD_003d4588_caseD_3;
          }
          local_b8 = uVar15;
          lVar10 = (*pcVar16)(pcVar17,(long)pcVar13 - (long)pcVar17,uVar6);
          if (lVar10 == 0) {
            lVar22 = local_108 * local_d0 + local_f0;
            do {
              as->length = (long)pcVar17 - (long)as->s;
              paVar9 = archive_string_ensure(as,as->buffer_length + lVar22);
              if (paVar9 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              pcVar17 = as->s + as->length;
              pcVar13 = as->s + local_c8 + as->buffer_length;
              lVar10 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,local_fc);
              pcVar24 = local_f8;
            } while (lVar10 == 0);
          }
          pcVar17 = pcVar17 + lVar10;
          uVar15 = local_b8;
          goto switchD_003d4767_default;
        }
        local_fc = ((uVar6 - 0x1100) * 0x15 + (local_88 - 0x1161)) * 0x1c + 0xac00;
LAB_003d460b:
        local_e8 = (char *)0x0;
      }
      else {
        if (pcVar21 != (char *)0x0) {
          if (pcVar13 < pcVar17 + local_b0) {
            as->length = (long)pcVar17 - (long)as->s;
            paVar9 = archive_string_ensure(as,local_108 * local_d0 + local_f0 + as->buffer_length);
            if (paVar9 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            pcVar17 = as->s + as->length;
            pcVar13 = as->s + local_c8 + as->buffer_length;
            uVar5 = (uint)local_b0;
          }
          pcVar24 = local_f8;
          switch(uVar5) {
          case 4:
            cVar3 = *pcVar21;
            pcVar21 = pcVar21 + 1;
            *pcVar17 = cVar3;
            pcVar17 = pcVar17 + 1;
          case 3:
switchD_003d4588_caseD_3:
            cVar3 = *pcVar21;
            pcVar21 = pcVar21 + 1;
            *pcVar17 = cVar3;
            pcVar17 = pcVar17 + 1;
          case 2:
switchD_003d4588_caseD_2:
            cVar3 = *pcVar21;
            pcVar21 = pcVar21 + 1;
            *pcVar17 = cVar3;
            pcVar17 = pcVar17 + 1;
          case 1:
switchD_003d4588_caseD_1:
            cVar3 = *pcVar21;
            break;
          default:
            goto switchD_003d4767_default;
          }
          goto LAB_003d49f7;
        }
        lVar10 = (*pcVar16)(pcVar17,(long)pcVar13 - (long)pcVar17,uVar6);
        if (lVar10 == 0) {
          lVar22 = local_108 * local_d0 + local_f0;
          do {
            as->length = (long)pcVar17 - (long)as->s;
            paVar9 = archive_string_ensure(as,as->buffer_length + lVar22);
            if (paVar9 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            pcVar17 = as->s + as->length;
            pcVar13 = as->s + local_c8 + as->buffer_length;
            lVar10 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,local_fc);
          } while (lVar10 == 0);
        }
        pcVar17 = pcVar17 + lVar10;
        pcVar24 = local_f8;
switchD_003d4767_default:
        uVar5 = (uint)uVar15;
        local_fc = local_bc;
      }
LAB_003d4a06:
      uVar20 = (*local_a0)(&local_bc,pcVar24,local_108);
      uVar15 = (ulong)uVar5;
      pcVar21 = local_e8;
      uVar6 = local_fc;
      pcVar16 = local_e0;
      local_88 = local_bc;
      uVar19 = local_b0;
    }
    if (-1 < (int)uVar20) {
      if (pcVar21 == (char *)0x0) {
        local_b0 = uVar19;
        lVar10 = (*pcVar16)(pcVar17,(long)pcVar13 - (long)pcVar17,uVar6);
        if (lVar10 == 0) {
          lVar22 = local_108 * local_d0 + local_f0;
          do {
            as->length = (long)pcVar17 - (long)as->s;
            paVar9 = archive_string_ensure(as,as->buffer_length + lVar22);
            if (paVar9 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            pcVar17 = as->s + as->length;
            lVar10 = (*pcVar16)(pcVar17,as->s + ((local_c8 + as->buffer_length) - (long)pcVar17),
                                local_fc);
          } while (lVar10 == 0);
        }
        pcVar17 = pcVar17 + lVar10;
      }
      else {
        if (pcVar13 < pcVar17 + local_b0) {
          as->length = (long)pcVar17 - (long)as->s;
          local_b0 = uVar19;
          paVar9 = archive_string_ensure(as,local_108 * local_d0 + local_f0 + as->buffer_length);
          if (paVar9 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          pcVar17 = as->s + as->length;
        }
        switch(uVar5) {
        case 4:
          cVar3 = *pcVar21;
          pcVar21 = pcVar21 + 1;
          *pcVar17 = cVar3;
          pcVar17 = pcVar17 + 1;
        case 3:
          cVar3 = *pcVar21;
          pcVar21 = pcVar21 + 1;
          *pcVar17 = cVar3;
          pcVar17 = pcVar17 + 1;
        case 2:
          cVar3 = *pcVar21;
          pcVar21 = pcVar21 + 1;
          *pcVar17 = cVar3;
          pcVar17 = pcVar17 + 1;
        case 1:
          *pcVar17 = *pcVar21;
          pcVar17 = pcVar17 + 1;
        }
      }
      goto switchD_003d5584_default;
    }
    if (pcVar21 == (char *)0x0) {
      local_b8 = uVar15;
      local_b0 = uVar19;
      lVar10 = (*pcVar16)(pcVar17,(long)pcVar13 - (long)pcVar17,uVar6);
      if (lVar10 == 0) {
        lVar22 = local_108 * local_d0 + local_f0;
        local_f8 = pcVar24;
        do {
          as->length = (long)pcVar17 - (long)as->s;
          paVar9 = archive_string_ensure(as,as->buffer_length + lVar22);
          if (paVar9 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          pcVar17 = as->s + as->length;
          pcVar13 = as->s + local_c8 + as->buffer_length;
          lVar10 = (*pcVar16)(pcVar17,(long)pcVar13 - (long)pcVar17,local_fc);
          pcVar24 = local_f8;
        } while (lVar10 == 0);
      }
      pcVar17 = pcVar17 + lVar10;
    }
    else {
      uVar18 = local_b0;
      local_b8 = uVar15;
      if (pcVar13 < pcVar17 + local_b0) {
        as->length = (long)pcVar17 - (long)as->s;
        local_e8 = pcVar21;
        paVar9 = archive_string_ensure(as,local_108 * local_d0 + local_f0 + as->buffer_length);
        if (paVar9 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar17 = as->s + as->length;
        pcVar13 = as->s + local_c8 + as->buffer_length;
        pcVar21 = local_e8;
        uVar18 = local_b0;
        uVar19 = local_b0;
      }
      local_b0 = uVar19;
      pcVar16 = local_e0;
      switch((int)uVar18) {
      case 1:
        break;
      case 4:
        cVar3 = *pcVar21;
        pcVar21 = pcVar21 + 1;
        *pcVar17 = cVar3;
        pcVar17 = pcVar17 + 1;
      case 3:
        cVar3 = *pcVar21;
        pcVar21 = pcVar21 + 1;
        *pcVar17 = cVar3;
        pcVar17 = pcVar17 + 1;
      case 2:
        cVar3 = *pcVar21;
        pcVar21 = pcVar21 + 1;
        *pcVar17 = cVar3;
        pcVar17 = pcVar17 + 1;
        break;
      default:
        goto switchD_003d4c4d_default;
      }
      *pcVar17 = *pcVar21;
      pcVar17 = pcVar17 + 1;
    }
switchD_003d4c4d_default:
    lVar10 = (*pcVar16)(pcVar17,(long)pcVar13 - (long)pcVar17,local_bc);
    if (lVar10 == 0) {
      lVar22 = local_108 * local_d0 + local_f0;
      local_f8 = pcVar24;
      do {
        as->length = (long)pcVar17 - (long)as->s;
        paVar9 = archive_string_ensure(as,as->buffer_length + lVar22);
        if (paVar9 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar17 = as->s + as->length;
        pcVar13 = as->s + local_c8 + as->buffer_length;
        lVar10 = (*pcVar16)(pcVar17,(long)pcVar13 - (long)pcVar17,local_bc);
        pcVar24 = local_f8;
      } while (lVar10 == 0);
    }
    pcVar17 = pcVar17 + lVar10;
    pcVar24 = pcVar24 + (uint)-(int)local_b8;
    local_108 = local_108 - (uint)-(int)local_b8;
  }
  local_d4 = L'\xffffffff';
  goto LAB_003d4d9b;
  while( true ) {
    local_f8 = local_f8 + uVar5;
    local_108 = local_108 - uVar5;
    local_58[uVar15] = (uint)local_e8;
    if (uVar15 == 9) {
      local_d4 = L'\xffffffff';
      uVar20 = 10;
      local_b8 = CONCAT44(local_b8._4_4_,(uint)local_e8);
      local_a8 = uVar5;
      goto LAB_003d4f30;
    }
    uVar5 = (*local_a0)(puVar25);
    puVar25 = puVar25 + 4;
    uVar15 = uVar15 + 1;
    uVar20 = (uint)local_e8;
    if ((int)uVar5 < 1) break;
LAB_003d4e08:
    pcVar24 = local_e8;
    uVar8 = *(uint *)(puVar25 + -4);
    local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
    if (uVar8 < 0x1d245) {
      local_e8._4_4_ = SUB84(pcVar24,4);
      local_e8 = (char *)CONCAT44(local_e8._4_4_,
                                  (uint)ccc_val[ccc_val_index[""[uVar8 >> 8]][uVar8 >> 4 & 0xf]]
                                        [uVar8 & 0xf]);
    }
    if ((((uint)local_e8 != 0xe4) && (uVar20 != 0xe4)) && ((uint)local_e8 <= uVar20)) break;
  }
LAB_003d4ed7:
  local_b8 = CONCAT44(local_b8._4_4_,uVar20);
  if (9 < uVar15) {
    local_d4 = L'\xffffffff';
  }
  uVar20 = (uint)uVar15;
  if (9 < uVar15) {
    uVar20 = 10;
  }
  pcVar24 = local_90;
  local_a8 = uVar5;
  if (1 < (int)uVar20) {
LAB_003d4f30:
    uVar5 = 1;
    uVar15 = (ulong)uVar20;
    pcVar24 = local_90;
    do {
      lVar10 = (long)(int)uVar5;
      local_90 = pcVar24;
      uVar6 = get_nfc(local_fc,(&local_88)[lVar10]);
      if (uVar6 == 0) {
        uVar5 = uVar5 + 1;
        pcVar24 = local_90;
      }
      else {
        iVar7 = uVar5 + 1;
        uVar20 = (uint)uVar15;
        if (iVar7 < (int)uVar20) {
          lVar22 = 0;
          do {
            iVar14 = uVar5 + (int)lVar22;
            (&local_88)[iVar14] = (&local_88)[iVar7 + lVar22];
            local_58[iVar14] = local_58[iVar7 + lVar22];
            lVar22 = lVar22 + 1;
          } while ((1 - uVar20) + uVar5 + (int)lVar22 != 0);
        }
        local_fc = uVar6;
        if ((((int)uVar20 < 2) || (uVar5 != uVar20 - 1)) || ((int)local_a8 < 1)) {
LAB_003d510c:
          uVar15 = (ulong)(uVar20 - 1);
        }
        else {
          if ((uint)local_e8 != (int)local_b8) goto LAB_003d510c;
          local_b8 = CONCAT44(local_b8._4_4_,local_58[uVar20 - 2]);
          uVar8 = local_a8;
          if ((uVar20 < 0xb) &&
             (uVar8 = (*local_a0)(&local_88 + lVar10,local_f8,local_108), 0 < (int)uVar8)) {
            puVar25 = local_80 + lVar10 * 4 + -4;
            iVar7 = (int)local_b8;
            do {
              pcVar24 = local_e8;
              uVar20 = *(uint *)(puVar25 + -4);
              local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
              if (uVar20 < 0x1d245) {
                local_e8._4_4_ = SUB84(pcVar24,4);
                local_e8 = (char *)CONCAT44(local_e8._4_4_,
                                            (uint)ccc_val[ccc_val_index[""[uVar20 >> 8]]
                                                          [uVar20 >> 4 & 0xf]][uVar20 & 0xf]);
              }
              if ((((uint)local_e8 != 0xe4) && (iVar7 != 0xe4)) && ((int)(uint)local_e8 <= iVar7)) {
                local_b8 = CONCAT44(local_b8._4_4_,iVar7);
                local_a8 = uVar8;
                goto LAB_003d5134;
              }
              local_f8 = local_f8 + uVar8;
              local_108 = local_108 - uVar8;
              local_58[lVar10] = (uint)local_e8;
              if (lVar10 == 9) {
                uVar5 = 10;
                local_b8 = CONCAT44(local_b8._4_4_,(uint)local_e8);
                goto LAB_003d514b;
              }
              uVar8 = (*local_a0)();
              puVar25 = puVar25 + 4;
              lVar10 = lVar10 + 1;
              iVar7 = (uint)local_e8;
            } while (0 < (int)uVar8);
            local_b8 = CONCAT44(local_b8._4_4_,(uint)local_e8);
            local_a8 = uVar8;
LAB_003d5134:
            uVar5 = (uint)lVar10;
            uVar8 = local_a8;
          }
LAB_003d514b:
          local_a8 = uVar8;
          if (9 < (int)uVar5) {
            local_d4 = L'\xffffffff';
          }
          uVar15 = (ulong)uVar5;
          if (9 < (int)uVar5) {
            uVar15 = 10;
          }
        }
        uVar5 = 0;
        pcVar24 = (char *)0x0;
      }
    } while ((int)uVar5 < (int)uVar15);
  }
  if (pcVar24 == (char *)0x0) {
    lVar10 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,local_fc);
    if (lVar10 == 0) {
      lVar22 = local_108 * local_d0 + local_f0;
      do {
        as->length = (long)pcVar17 - (long)as->s;
        paVar9 = archive_string_ensure(as,as->buffer_length + lVar22);
        if (paVar9 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar17 = as->s + as->length;
        pcVar13 = as->s + local_c8 + as->buffer_length;
        lVar10 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,local_fc);
      } while (lVar10 == 0);
    }
    pcVar17 = pcVar17 + lVar10;
  }
  else {
    uVar12 = (undefined4)local_b0;
    if (pcVar13 < pcVar17 + (local_b0 & 0xffffffff)) {
      as->length = (long)pcVar17 - (long)as->s;
      paVar9 = archive_string_ensure(as,local_108 * local_d0 + local_f0 + as->buffer_length);
      if (paVar9 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      pcVar17 = as->s + as->length;
      pcVar13 = as->s + local_c8 + as->buffer_length;
      uVar12 = (undefined4)local_b0;
    }
    switch(uVar12) {
    case 4:
      cVar3 = *pcVar24;
      pcVar24 = pcVar24 + 1;
      *pcVar17 = cVar3;
      pcVar17 = pcVar17 + 1;
    case 3:
      cVar3 = *pcVar24;
      pcVar24 = pcVar24 + 1;
      *pcVar17 = cVar3;
      pcVar17 = pcVar17 + 1;
    case 2:
      cVar3 = *pcVar24;
      pcVar24 = pcVar24 + 1;
      *pcVar17 = cVar3;
      pcVar17 = pcVar17 + 1;
    case 1:
      *pcVar17 = *pcVar24;
      pcVar17 = pcVar17 + 1;
    }
  }
  if (0 < (int)uVar15) {
    lVar10 = local_108 * local_d0 + local_f0;
    uVar19 = 0;
    do {
      while (lVar22 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,(&local_88)[uVar19]),
            lVar22 == 0) {
        as->length = (long)pcVar17 - (long)as->s;
        paVar9 = archive_string_ensure(as,as->buffer_length + lVar10);
        if (paVar9 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar17 = as->s + as->length;
        pcVar13 = as->s + local_c8 + as->buffer_length;
      }
      pcVar17 = pcVar17 + lVar22;
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uVar15 & 0xffffffff));
  }
  pcVar16 = local_e0;
  pcVar24 = local_f8;
  if (0 < (int)local_a8) {
    if ((((uint)local_e8 == (int)local_b8) && (local_108 != 0)) &&
       (uVar20 = (*local_a0)(&local_88,local_f8,local_108), 0 < (int)uVar20)) {
      iVar7 = (int)local_b8;
      do {
        uVar5 = 0;
        if (local_88 < 0x1d245) {
          uVar5 = (uint)ccc_val[ccc_val_index[""[local_88 >> 8]][local_88 >> 4 & 0xf]]
                        [local_88 & 0xf];
        }
        local_f8 = (char *)CONCAT44(local_f8._4_4_,uVar5);
        if ((int)uVar5 < iVar7) break;
        local_108 = local_108 - uVar20;
        lVar10 = (*pcVar16)(pcVar17,(long)pcVar13 - (long)pcVar17);
        if (lVar10 == 0) {
          lVar22 = local_108 * local_d0 + local_f0;
          do {
            as->length = (long)pcVar17 - (long)as->s;
            paVar9 = archive_string_ensure(as,as->buffer_length + lVar22);
            if (paVar9 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            pcVar17 = as->s + as->length;
            pcVar13 = as->s + local_c8 + as->buffer_length;
            lVar10 = (*local_e0)(pcVar17,(long)pcVar13 - (long)pcVar17,local_88);
            pcVar16 = local_e0;
          } while (lVar10 == 0);
        }
        pcVar17 = pcVar17 + lVar10;
        pcVar24 = pcVar24 + uVar20;
        uVar20 = (*local_a0)(&local_88,pcVar24,local_108);
        iVar7 = (int)local_f8;
      } while (0 < (int)uVar20);
    }
  }
LAB_003d4d9b:
  uVar20 = (*local_a0)(&local_fc,pcVar24,local_108);
  if (uVar20 == 0) goto switchD_003d5584_default;
  goto LAB_003d4411;
}

Assistant:

static int
archive_string_normalize_C(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s = (const char *)_p;
	char *p, *endp;
	uint32_t uc, uc2;
	size_t w;
	int always_replace, n, n2, ret = 0, spair, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	always_replace = 1;
	ts = 1;/* text size. */
	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16BE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16LE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		if (sc->flag & SCONV_FROM_UTF8)
			always_replace = 0;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		always_replace = 0;
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
		spair = 6;/* surrogate pair size in UTF-8. */
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		const char *ucptr, *uc2ptr;

		if (n < 0) {
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc);
			s += n*-1;
			len -= n*-1;
			ret = -1;
			continue;
		} else if (n == spair || always_replace)
			/* uc is converted from a surrogate pair.
			 * this should be treated as a changed code. */
			ucptr = NULL;
		else
			ucptr = s;
		s += n;
		len -= n;

		/* Read second code point. */
		while ((n2 = parse(&uc2, s, len)) > 0) {
			uint32_t ucx[FDC_MAX];
			int ccx[FDC_MAX];
			int cl, cx, i, nx, ucx_size;
			int LIndex,SIndex;
			uint32_t nfc;

			if (n2 == spair || always_replace)
				/* uc2 is converted from a surrogate pair.
			 	 * this should be treated as a changed code. */
				uc2ptr = NULL;
			else
				uc2ptr = s;
			s += n2;
			len -= n2;

			/*
			 * If current second code point is out of decomposable
			 * code points, finding compositions is unneeded.
			 */
			if (!IS_DECOMPOSABLE_BLOCK(uc2)) {
				WRITE_UC();
				REPLACE_UC_WITH_UC2();
				continue;
			}

			/*
			 * Try to combine current code points.
			 */
			/*
			 * We have to combine Hangul characters according to
			 * http://uniicode.org/reports/tr15/#Hangul
			 */
			if (0 <= (LIndex = uc - HC_LBASE) &&
			    LIndex < HC_LCOUNT) {
				/*
				 * Hangul Composition.
				 * 1. Two current code points are L and V.
				 */
				int VIndex = uc2 - HC_VBASE;
				if (0 <= VIndex && VIndex < HC_VCOUNT) {
					/* Make syllable of form LV. */
					UPDATE_UC(HC_SBASE +
					    (LIndex * HC_VCOUNT + VIndex) *
					     HC_TCOUNT);
				} else {
					WRITE_UC();
					REPLACE_UC_WITH_UC2();
				}
				continue;
			} else if (0 <= (SIndex = uc - HC_SBASE) &&
			    SIndex < HC_SCOUNT && (SIndex % HC_TCOUNT) == 0) {
				/*
				 * Hangul Composition.
				 * 2. Two current code points are LV and T.
				 */
				int TIndex = uc2 - HC_TBASE;
				if (0 < TIndex && TIndex < HC_TCOUNT) {
					/* Make syllable of form LVT. */
					UPDATE_UC(uc + TIndex);
				} else {
					WRITE_UC();
					REPLACE_UC_WITH_UC2();
				}
				continue;
			} else if ((nfc = get_nfc(uc, uc2)) != 0) {
				/* A composition to current code points
				 * is found. */
				UPDATE_UC(nfc);
				continue;
			} else if ((cl = CCC(uc2)) == 0) {
				/* Clearly 'uc2' the second code point is not
				 * a decomposable code. */
				WRITE_UC();
				REPLACE_UC_WITH_UC2();
				continue;
			}

			/*
			 * Collect following decomposable code points.
			 */
			cx = 0;
			ucx[0] = uc2;
			ccx[0] = cl;
			COLLECT_CPS(1);

			/*
			 * Find a composed code in the collected code points.
			 */
			i = 1;
			while (i < ucx_size) {
				int j;

				if ((nfc = get_nfc(uc, ucx[i])) == 0) {
					i++;
					continue;
				}

				/*
				 * nfc is composed of uc and ucx[i].
				 */
				UPDATE_UC(nfc);

				/*
				 * Remove ucx[i] by shifting
				 * following code points.
				 */
				for (j = i; j+1 < ucx_size; j++) {
					ucx[j] = ucx[j+1];
					ccx[j] = ccx[j+1];
				}
				ucx_size --;

				/*
				 * Collect following code points blocked
				 * by ucx[i] the removed code point.
				 */
				if (ucx_size > 0 && i == ucx_size &&
				    nx > 0 && cx == cl) {
					cl =  ccx[ucx_size-1];
					COLLECT_CPS(ucx_size);
				}
				/*
				 * Restart finding a composed code with
				 * the updated uc from the top of the
				 * collected code points.
				 */
				i = 0;
			}

			/*
			 * Apparently the current code points are not
			 * decomposed characters or already composed.
			 */
			WRITE_UC();
			for (i = 0; i < ucx_size; i++)
				UNPARSE(p, endp, ucx[i]);

			/*
			 * Flush out remaining canonical combining characters.
			 */
			if (nx > 0 && cx == cl && len > 0) {
				while ((nx = parse(&ucx[0], s, len))
				    > 0) {
					cx = CCC(ucx[0]);
					if (cl > cx)
						break;
					s += nx;
					len -= nx;
					cl = cx;
					UNPARSE(p, endp, ucx[0]);
				}
			}
			break;
		}
		if (n2 < 0) {
			WRITE_UC();
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc2);
			s += n2*-1;
			len -= n2*-1;
			ret = -1;
			continue;
		} else if (n2 == 0) {
			WRITE_UC();
			break;
		}
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}